

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

uint8_t absl::lts_20250127::str_format_internal::anon_unknown_0::
        GetNibble<absl::lts_20250127::uint128>(uint128 n,size_t nibble_index)

{
  uchar uVar1;
  int in_ECX;
  uint128 lhs;
  uint128 local_a8;
  size_t local_98;
  uint64_t local_90;
  uint128 local_88;
  uint128 local_78;
  undefined8 local_68;
  undefined8 local_60;
  uint128 local_58;
  uint local_3c;
  undefined8 uStack_38;
  int shift;
  uint128 mask_low_nibble;
  size_t nibble_index_local;
  uint128 n_local;
  
  n_local.lo_ = n.hi_;
  nibble_index_local = n.lo_;
  uStack_38 = 0xf;
  mask_low_nibble.lo_ = 0;
  local_3c = (uint)(nibble_index << 2);
  local_68 = 0xf;
  local_60 = 0;
  local_58 = lts_20250127::operator<<
                       ((lts_20250127 *)0xf,(uint128)(ZEXT416(local_3c) << 0x40),in_ECX);
  uint128::operator&=((uint128 *)&nibble_index_local,local_58);
  local_98 = nibble_index_local;
  local_90 = n_local.lo_;
  lhs.hi_._0_4_ = local_3c;
  lhs.lo_ = n_local.lo_;
  lhs.hi_._4_4_ = 0;
  local_88 = operator>>((lts_20250127 *)nibble_index_local,lhs,in_ECX);
  uint128::uint128(&local_a8,0xf);
  local_78 = operator&(local_88,local_a8);
  uVar1 = uint128::operator_cast_to_unsigned_char(&local_78);
  return uVar1;
}

Assistant:

uint8_t GetNibble(Int n, size_t nibble_index) {
  constexpr Int mask_low_nibble = Int{0xf};
  int shift = static_cast<int>(nibble_index * 4);
  n &= mask_low_nibble << shift;
  return static_cast<uint8_t>((n >> shift) & 0xf);
}